

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupTimes(Gia_Man_t *p,int nTimes)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Vec_Int_t *__ptr;
  int *piVar9;
  Vec_Int_t *__ptr_00;
  Vec_Int_t *__ptr_01;
  Vec_Int_t *__ptr_02;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  Vec_Int_t *p_01;
  int iVar15;
  int iVar16;
  
  if (nTimes < 1) {
    __assert_fail("nTimes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x569,"Gia_Man_t *Gia_ManDupTimes(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pName = pcVar8;
  pcVar1 = p->pSpec;
  piVar9 = (int *)0x0;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pSpec = pcVar8;
  p->pObjs->Value = 0;
  iVar6 = p->nRegs;
  iVar15 = (p->vCis->nSize - iVar6) * nTimes;
  __ptr = (Vec_Int_t *)malloc(0x10);
  if (iVar15 - 1U < 0xf) {
    iVar15 = 0x10;
  }
  __ptr->nSize = 0;
  __ptr->nCap = iVar15;
  if (iVar15 != 0) {
    piVar9 = (int *)malloc((long)iVar15 << 2);
  }
  __ptr->pArray = piVar9;
  iVar15 = (p->vCos->nSize - iVar6) * nTimes;
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  if (iVar15 - 1U < 0xf) {
    iVar15 = 0x10;
  }
  __ptr_00->nSize = 0;
  __ptr_00->nCap = iVar15;
  if (iVar15 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar15 << 2);
  }
  __ptr_00->pArray = piVar9;
  __ptr_01 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar6 * nTimes - 1U) {
    iVar15 = iVar6 * nTimes;
  }
  __ptr_01->nSize = 0;
  __ptr_01->nCap = iVar15;
  if (iVar15 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar15 * 4);
  }
  __ptr_01->pArray = piVar9;
  __ptr_02 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0;
  __ptr_02->nSize = 0;
  __ptr_02->nCap = iVar15;
  if (iVar15 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar15 << 2);
  }
  __ptr_02->pArray = piVar9;
  iVar15 = 1;
  if (1 < nTimes) {
    iVar15 = nTimes;
  }
  do {
    if (1 < p->nObjs) {
      lVar13 = 1;
      lVar12 = 0;
      do {
        pGVar2 = p->pObjs;
        uVar3 = *(ulong *)(&pGVar2[1].field_0x0 + lVar12);
        uVar14 = (uint)uVar3;
        iVar5 = (int)(uVar3 & 0x1fffffff);
        if ((uVar3 & 0x1fffffff) == 0x1fffffff || (int)uVar14 < 0) {
          if ((uVar14 & 0x9fffffff) == 0x9fffffff) {
            pGVar10 = Gia_ManAppendObj(p_00);
            uVar3 = *(ulong *)pGVar10;
            *(ulong *)pGVar10 = uVar3 | 0x9fffffff;
            *(ulong *)pGVar10 =
                 uVar3 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar4 = p_00->pObjs;
            if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_001dfe61:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
            pGVar4 = p_00->pObjs;
            if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_001dfe61;
            iVar16 = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2);
            iVar5 = iVar16 * 0x55555556;
            *(int *)((long)&pGVar2[1].Value + lVar12) = iVar5;
            p_01 = __ptr_02;
            if ((((uint)*(undefined8 *)(&pGVar2[1].field_0x0 + lVar12) & 0x9fffffff) == 0x9fffffff)
               && ((int)((uint)((ulong)*(undefined8 *)(&pGVar2[1].field_0x0 + lVar12) >> 0x20) &
                        0x1fffffff) < p->vCis->nSize - p->nRegs)) {
              p_01 = __ptr;
            }
            if (iVar5 < 0) {
LAB_001dfe80:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar14 = iVar16 * -0x55555555 & 0x7fffffff;
          }
          else {
            if (-1 < (int)uVar14 || iVar5 == 0x1fffffff) goto LAB_001dfb55;
            uVar11 = *(uint *)((long)pGVar2 + lVar12 + (ulong)(uint)(iVar5 << 2) * -3 + 0x14);
            if ((int)uVar11 < 0) goto LAB_001dfe42;
            uVar14 = Gia_ManAppendCo(p_00,uVar11 ^ uVar14 >> 0x1d & 1);
            *(uint *)((long)&pGVar2[1].Value + lVar12) = uVar14;
            uVar11 = (uint)*(undefined8 *)(&pGVar2[1].field_0x0 + lVar12);
            p_01 = __ptr_01;
            if (((~uVar11 & 0x1fffffff) != 0 && (int)uVar11 < 0) &&
               ((int)((uint)((ulong)*(undefined8 *)(&pGVar2[1].field_0x0 + lVar12) >> 0x20) &
                     0x1fffffff) < p->vCos->nSize - p->nRegs)) {
              p_01 = __ptr_00;
            }
            if ((int)uVar14 < 0) goto LAB_001dfe80;
            uVar14 = uVar14 >> 1;
          }
          Vec_IntPush(p_01,uVar14);
        }
        else {
          uVar14 = *(uint *)((long)pGVar2 + lVar12 + (ulong)(uint)(iVar5 << 2) * -3 + 0x14);
          if (((int)uVar14 < 0) ||
             (uVar11 = *(uint *)((long)pGVar2 +
                                lVar12 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3 + 0x14),
             (int)uVar11 < 0)) {
LAB_001dfe42:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          iVar5 = Gia_ManAppendAnd(p_00,uVar14 ^ (uint)(uVar3 >> 0x1d) & 1,
                                   uVar11 ^ (uint)(uVar3 >> 0x3d) & 1);
          *(int *)((long)&pGVar2[1].Value + lVar12) = iVar5;
        }
LAB_001dfb55:
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0xc;
      } while (lVar13 < p->nObjs);
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != iVar15);
  p_00->vCis->nSize = 0;
  iVar6 = __ptr->nSize;
  if (0 < (long)iVar6) {
    piVar9 = __ptr->pArray;
    lVar12 = 0;
    do {
      iVar15 = piVar9[lVar12];
      lVar13 = (long)iVar15;
      if ((lVar13 < 0) || (p_00->nObjs <= iVar15)) goto LAB_001dfe9f;
      uVar3 = *(ulong *)(p_00->pObjs + lVar13);
      if (-1 < (int)uVar3) goto LAB_001dfebe;
      *(ulong *)(p_00->pObjs + lVar13) =
           uVar3 & 0xe0000000ffffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      Vec_IntPush(p_00->vCis,iVar15);
      lVar12 = lVar12 + 1;
    } while (iVar6 != lVar12);
  }
  iVar6 = __ptr_02->nSize;
  if (0 < (long)iVar6) {
    piVar9 = __ptr_02->pArray;
    lVar12 = 0;
    do {
      iVar15 = piVar9[lVar12];
      lVar13 = (long)iVar15;
      if ((lVar13 < 0) || (p_00->nObjs <= iVar15)) goto LAB_001dfe9f;
      uVar3 = *(ulong *)(p_00->pObjs + lVar13);
      if (-1 < (int)uVar3) goto LAB_001dfebe;
      *(ulong *)(p_00->pObjs + lVar13) =
           uVar3 & 0xe0000000ffffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      Vec_IntPush(p_00->vCis,iVar15);
      lVar12 = lVar12 + 1;
    } while (iVar6 != lVar12);
  }
  p_00->vCos->nSize = 0;
  iVar6 = __ptr_00->nSize;
  if (0 < (long)iVar6) {
    piVar9 = __ptr_00->pArray;
    lVar12 = 0;
    do {
      iVar15 = piVar9[lVar12];
      lVar13 = (long)iVar15;
      if ((lVar13 < 0) || (p_00->nObjs <= iVar15)) goto LAB_001dfe9f;
      uVar3 = *(ulong *)(p_00->pObjs + lVar13);
      if (-1 < (int)uVar3) goto LAB_001dfebe;
      *(ulong *)(p_00->pObjs + lVar13) =
           uVar3 & 0xe0000000ffffffff | (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      Vec_IntPush(p_00->vCos,iVar15);
      lVar12 = lVar12 + 1;
    } while (iVar6 != lVar12);
  }
  iVar6 = __ptr_01->nSize;
  if (0 < (long)iVar6) {
    piVar9 = __ptr_01->pArray;
    lVar12 = 0;
    do {
      iVar15 = piVar9[lVar12];
      lVar13 = (long)iVar15;
      if ((lVar13 < 0) || (p_00->nObjs <= iVar15)) {
LAB_001dfe9f:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar3 = *(ulong *)(p_00->pObjs + lVar13);
      if (-1 < (int)uVar3) {
LAB_001dfebe:
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1db,"void Gia_ObjSetCioId(Gia_Obj_t *, int)");
      }
      *(ulong *)(p_00->pObjs + lVar13) =
           uVar3 & 0xe0000000ffffffff | (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      Vec_IntPush(p_00->vCos,iVar15);
      lVar12 = lVar12 + 1;
    } while (iVar6 != lVar12);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  free(__ptr);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (int *)0x0;
  }
  free(__ptr_00);
  if (__ptr_01->pArray != (int *)0x0) {
    free(__ptr_01->pArray);
    __ptr_01->pArray = (int *)0x0;
  }
  free(__ptr_01);
  if (__ptr_02->pArray != (int *)0x0) {
    free(__ptr_02->pArray);
    __ptr_02->pArray = (int *)0x0;
  }
  free(__ptr_02);
  Gia_ManSetRegNum(p_00,nTimes * p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupTimes( Gia_Man_t * p, int nTimes )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vPis, * vPos, * vRis, * vRos;
    int i, t, Entry;
    assert( nTimes > 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    vPis = Vec_IntAlloc( Gia_ManPiNum(p) * nTimes );
    vPos = Vec_IntAlloc( Gia_ManPoNum(p) * nTimes );
    vRis = Vec_IntAlloc( Gia_ManRegNum(p) * nTimes );
    vRos = Vec_IntAlloc( Gia_ManRegNum(p) * nTimes );
    for ( t = 0; t < nTimes; t++ )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsAnd(pObj) )
                pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            else if ( Gia_ObjIsCi(pObj) )
            {
                pObj->Value = Gia_ManAppendCi( pNew );
                if ( Gia_ObjIsPi(p, pObj) )
                    Vec_IntPush( vPis, Abc_Lit2Var(pObj->Value) );
                else
                    Vec_IntPush( vRos, Abc_Lit2Var(pObj->Value) );
            }
            else if ( Gia_ObjIsCo(pObj) )
            {
                pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                if ( Gia_ObjIsPo(p, pObj) )
                    Vec_IntPush( vPos, Abc_Lit2Var(pObj->Value) );
                else
                    Vec_IntPush( vRis, Abc_Lit2Var(pObj->Value) );
            }
        }
    }
    Vec_IntClear( pNew->vCis );
    Vec_IntForEachEntry( vPis, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCis) );
        Vec_IntPush( pNew->vCis, Entry );
    }
    Vec_IntForEachEntry( vRos, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCis) );
        Vec_IntPush( pNew->vCis, Entry );
    }
    Vec_IntClear( pNew->vCos );
    Vec_IntForEachEntry( vPos, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCos) );
        Vec_IntPush( pNew->vCos, Entry );
    }
    Vec_IntForEachEntry( vRis, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCos) );
        Vec_IntPush( pNew->vCos, Entry );
    }
    Vec_IntFree( vPis );
    Vec_IntFree( vPos );
    Vec_IntFree( vRis );
    Vec_IntFree( vRos );
    Gia_ManSetRegNum( pNew, nTimes * Gia_ManRegNum(p) );
    return pNew;
}